

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

unsigned_long moodycamel::details::ceil_to_pow_2<unsigned_long>(unsigned_long x)

{
  ulong uVar1;
  size_t i;
  unsigned_long x_local;
  
  uVar1 = x - 1 >> 1 | x - 1;
  uVar1 = uVar1 >> 2 | uVar1;
  x_local = uVar1 >> 4 | uVar1;
  for (i = 1; i < 8; i = i << 1) {
    x_local = x_local >> ((byte)(i << 3) & 0x3f) | x_local;
  }
  return x_local + 1;
}

Assistant:

static inline T ceil_to_pow_2(T x)
    {
        static_assert(std::is_integral<T>::value && !std::numeric_limits<T>::is_signed, "ceil_to_pow_2 is intended to be used only with unsigned integer types");

        // Adapted from http://graphics.stanford.edu/~seander/bithacks.html#RoundUpPowerOf2
        --x;
        x |= x >> 1;
        x |= x >> 2;
        x |= x >> 4;
        for (std::size_t i = 1; i < sizeof(T); i <<= 1) {
            x |= x >> (i << 3);
        }
        ++x;
        return x;
    }